

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O1

Node * adios2::helper::anon_unknown_0::YAMLNode
                 (Node *__return_storage_ptr__,string *nodeName,Node *upperNode,string *hint,
                 bool isMandatory,value nodeType)

{
  element_type *peVar1;
  value vVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  undefined7 in_register_00000081;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  YAML::Node::operator[]<std::__cxx11::string>(__return_storage_ptr__,upperNode,nodeName);
  if (((int)CONCAT71(in_register_00000081,isMandatory) != 0) &&
     ((__return_storage_ptr__->m_isValid != true ||
      ((__return_storage_ptr__->m_pNode != (node *)0x0 &&
       (((((__return_storage_ptr__->m_pNode->m_pRef).
           super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
         super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_isDefined == false)))))) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Helper","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"adiosYAML","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"YAMLNode","");
    std::operator+(&local_50,"no ",nodeName);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_e0 = *plVar4;
      lStack_d8 = plVar3[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar4;
      local_f0 = (long *)*plVar3;
    }
    local_e8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f0,(ulong)(hint->_M_dataplus)._M_p);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = plVar3[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_d0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    Throw<std::invalid_argument>(&local_70,&local_90,&local_b0,&local_d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if ((__return_storage_ptr__->m_isValid == true) &&
     ((__return_storage_ptr__->m_pNode == (node *)0x0 ||
      (((((__return_storage_ptr__->m_pNode->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    if (__return_storage_ptr__->m_pNode == (node *)0x0) {
      vVar2 = Null;
    }
    else {
      peVar1 = (((__return_storage_ptr__->m_pNode->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      vVar2 = Undefined;
      if (peVar1->m_isDefined != false) {
        vVar2 = peVar1->m_type;
      }
    }
    if (vVar2 != nodeType) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Helper","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"adiosYAML","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"YAMLNode","");
      std::operator+(&local_50,"node ",nodeName);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_e0 = *plVar4;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar4;
        local_f0 = (long *)*plVar3;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_f0,(ulong)(hint->_M_dataplus)._M_p);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0.field_2._8_8_ = plVar3[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      Throw<std::invalid_argument>(&local_70,&local_90,&local_b0,&local_d0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

YAML::Node YAMLNode(const std::string nodeName, const YAML::Node &upperNode,
                    const std::string &hint, const bool isMandatory,
                    const YAML::NodeType::value nodeType)
{
    const YAML::Node node = upperNode[nodeName];

    if (isMandatory && !node)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosYAML", "YAMLNode",
            "no " + nodeName + " node found, (is your node key lower case?), " + hint);
    }
    if (node && node.Type() != nodeType)
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosYAML", "YAMLNode",
                                             "node " + nodeName +
                                                 " is the wrong type, review adios2 "
                                                 "config YAML specs for the node, " +
                                                 hint);
    }
    return node;
}